

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void dequantize_row_q5_0(block_q5_0 *x,float *y,int64_t k)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [13];
  uint5 uVar5;
  unkbyte9 Var6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  float *pfVar13;
  long lVar14;
  undefined1 in_XMM0 [16];
  undefined1 auVar15 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  long lVar21;
  undefined1 in_XMM11 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar32 [16];
  int iVar29;
  int iVar30;
  int iVar31;
  
  auVar9 = _DAT_0014e6d0;
  auVar8 = _DAT_0014e6c0;
  lVar14 = k + 0x1f;
  if (-1 < k) {
    lVar14 = k;
  }
  uVar10 = (uint)(lVar14 >> 5);
  if (0 < (int)uVar10) {
    puVar11 = x->qs;
    pfVar13 = y + 0x10;
    uVar12 = 0;
    do {
      uVar2 = *(uint *)x[uVar12].qh;
      fVar1 = ggml_table_f32_f16[x[uVar12].d];
      lVar14 = 0;
      auVar16 = _DAT_0014a030;
      auVar20 = _DAT_0014a030;
      do {
        auVar22 = pshuflw(in_XMM11,auVar16,0xfe);
        lVar21 = auVar22._0_8_;
        auVar23._0_4_ = uVar2 >> lVar21;
        auVar23._4_4_ = uVar2 >> lVar21;
        auVar23._8_4_ = uVar2 >> lVar21;
        auVar23._12_4_ = uVar2 >> lVar21;
        auVar25 = pshuflw(in_XMM13,auVar16,0x54);
        iVar17 = auVar16._4_4_;
        iVar18 = auVar16._8_4_;
        iVar19 = auVar16._12_4_;
        auVar22._0_8_ = auVar16._8_8_;
        auVar22._8_4_ = iVar18;
        auVar22._12_4_ = iVar19;
        auVar32 = pshuflw(in_XMM14,auVar22,0xfe);
        auVar26 = pshuflw(auVar22,auVar22,0x54);
        auVar27._0_4_ = auVar20._0_4_ + 0xc;
        iVar29 = auVar20._4_4_;
        auVar27._4_4_ = iVar29 + 0xc;
        iVar30 = auVar20._8_4_;
        iVar31 = auVar20._12_4_;
        auVar27._8_4_ = iVar30 + 0xc;
        auVar27._12_4_ = iVar31 + 0xc;
        auVar24 = pshuflw(auVar23,auVar27,0xfe);
        auVar22 = pshuflw(in_XMM0,auVar27,0x54);
        auVar15._4_4_ = auVar27._12_4_;
        auVar15._0_4_ = auVar27._8_4_;
        auVar15._8_4_ = auVar27._8_4_;
        auVar15._12_4_ = auVar27._12_4_;
        auVar28 = pshuflw(auVar27,auVar15,0xfe);
        lVar21 = auVar28._0_8_;
        in_XMM14._0_4_ = uVar2 >> lVar21;
        in_XMM14._4_4_ = uVar2 >> lVar21;
        in_XMM14._8_4_ = uVar2 >> lVar21;
        in_XMM14._12_4_ = uVar2 >> lVar21;
        auVar15 = pshuflw(auVar15,auVar15,0x54);
        auVar28._0_4_ = (uVar2 >> auVar25._0_8_) << 4;
        auVar28._4_4_ = auVar23._4_4_ << 4;
        auVar28._8_4_ = (uVar2 >> auVar26._0_8_) << 4;
        auVar28._12_4_ = (uVar2 >> auVar32._0_8_) << 4;
        uVar3 = *(uint *)(puVar11 + lVar14);
        auVar4[0xc] = (char)(uVar3 >> 0x18);
        auVar4._0_12_ = ZEXT712(0);
        uVar5 = CONCAT32(auVar4._10_3_,(ushort)(byte)(uVar3 >> 0x10));
        auVar7._5_8_ = 0;
        auVar7._0_5_ = uVar5;
        Var6 = CONCAT72(SUB137(auVar7 << 0x40,6),(ushort)(byte)(uVar3 >> 8));
        auVar25._0_4_ = uVar3 & 0xff;
        auVar25._4_9_ = Var6;
        auVar25._13_3_ = 0;
        auVar25 = auVar25 & auVar9 | auVar28 & auVar8;
        in_XMM13._0_4_ = auVar25._0_4_ + -0x10;
        in_XMM13._4_4_ = auVar25._4_4_ + -0x10;
        in_XMM13._8_4_ = auVar25._8_4_ + -0x10;
        in_XMM13._12_4_ = auVar25._12_4_ + -0x10;
        in_XMM11._0_4_ = (float)in_XMM13._0_4_ * fVar1;
        in_XMM11._4_4_ = (float)in_XMM13._4_4_ * fVar1;
        in_XMM11._8_4_ = (float)in_XMM13._8_4_ * fVar1;
        in_XMM11._12_4_ = (float)in_XMM13._12_4_ * fVar1;
        *(undefined1 (*) [16])(pfVar13 + lVar14 + -0x10) = in_XMM11;
        in_XMM0._0_4_ =
             (float)(int)((uVar3 >> 4 & 0xf | uVar2 >> auVar22._0_8_ & auVar8._0_4_) - 0x10) * fVar1
        ;
        in_XMM0._4_4_ =
             (float)(int)(((uint)Var6 >> 4 | uVar2 >> auVar24._0_8_ & auVar8._4_4_) - 0x10) * fVar1;
        in_XMM0._8_4_ =
             (float)(int)(((uint)uVar5 >> 4 | uVar2 >> auVar15._0_8_ & auVar8._8_4_) - 0x10) * fVar1
        ;
        in_XMM0._12_4_ =
             (float)(int)(((uint)(uint3)(auVar4._10_3_ >> 0x14) | in_XMM14._12_4_ & auVar8._12_4_) -
                         0x10) * fVar1;
        *(undefined1 (*) [16])(pfVar13 + lVar14) = in_XMM0;
        lVar14 = lVar14 + 4;
        auVar16._0_4_ = auVar16._0_4_ + 4;
        auVar16._4_4_ = iVar17 + 4;
        auVar16._8_4_ = iVar18 + 4;
        auVar16._12_4_ = iVar19 + 4;
        auVar20._0_4_ = auVar20._0_4_ + 4;
        auVar20._4_4_ = iVar29 + 4;
        auVar20._8_4_ = iVar30 + 4;
        auVar20._12_4_ = iVar31 + 4;
      } while (lVar14 != 0x10);
      uVar12 = uVar12 + 1;
      puVar11 = puVar11 + 0x16;
      pfVar13 = pfVar13 + 0x20;
    } while (uVar12 != (uVar10 & 0x7fffffff));
  }
  return;
}

Assistant:

void dequantize_row_q5_0(const block_q5_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK5_0;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        uint32_t qh;
        memcpy(&qh, x[i].qh, sizeof(qh));

        for (int j = 0; j < qk/2; ++j) {
            const uint8_t xh_0 = ((qh >> (j +  0)) << 4) & 0x10;
            const uint8_t xh_1 = ((qh >> (j + 12))     ) & 0x10;

            const int32_t x0 = ((x[i].qs[j] & 0x0F) | xh_0) - 16;
            const int32_t x1 = ((x[i].qs[j] >>   4) | xh_1) - 16;

            y[i*qk + j + 0   ] = x0*d;
            y[i*qk + j + qk/2] = x1*d;
        }
    }
}